

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mpack.h
# Opt level: O1

float mpack_node_float(mpack_node_t node)

{
  ulong uVar1;
  mpack_tree_t *pmVar2;
  mpack_node_data_t *pmVar3;
  
  pmVar2 = node.tree;
  pmVar3 = node.data;
  if (pmVar2->error == mpack_ok) {
    switch(pmVar3->type) {
    case mpack_type_int:
      return (float)(pmVar3->value).i;
    case mpack_type_uint:
      uVar1 = (pmVar3->value).i;
      if ((long)uVar1 < 0) {
        return (float)uVar1;
      }
      return (float)(long)uVar1;
    case mpack_type_float:
      return (pmVar3->value).f;
    case mpack_type_double:
      return (float)(pmVar3->value).d;
    default:
      pmVar2->error = mpack_error_type;
      if (pmVar2->error_fn != (mpack_tree_error_t)0x0) {
        (*pmVar2->error_fn)(pmVar2,mpack_error_type);
        return 0.0;
      }
    }
  }
  return 0.0;
}

Assistant:

MPACK_INLINE float mpack_node_float(mpack_node_t node) {
    if (mpack_node_error(node) != mpack_ok)
        return 0.0f;

    if (node.data->type == mpack_type_uint)
        return (float)node.data->value.u;
    else if (node.data->type == mpack_type_int)
        return (float)node.data->value.i;
    else if (node.data->type == mpack_type_float)
        return node.data->value.f;
    else if (node.data->type == mpack_type_double)
        return (float)node.data->value.d;

    mpack_node_flag_error(node, mpack_error_type);
    return 0.0f;
}